

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O0

void __thiscall
VPLGrammar::Parser::BitwiseXorExpressionNode::BuildProgram
          (BitwiseXorExpressionNode *this,Scope *scope,ostream *out)

{
  const_reference pvVar1;
  pointer pAVar2;
  size_type sVar3;
  ulong local_28;
  size_t i;
  ostream *out_local;
  Scope *scope_local;
  BitwiseXorExpressionNode *this_local;
  
  pvVar1 = std::
           vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
           ::operator[](&(this->super_ASTNodeBasic).children_,0);
  pAVar2 = std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
           ::operator->(pvVar1);
  (*pAVar2->_vptr_ASTNodeBasic[5])(pAVar2,scope,out);
  local_28 = 1;
  while( true ) {
    sVar3 = std::
            vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
            ::size(&(this->super_ASTNodeBasic).children_);
    if (sVar3 <= local_28) break;
    pvVar1 = std::
             vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
             ::operator[](&(this->super_ASTNodeBasic).children_,local_28);
    pAVar2 = std::
             unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>::
             operator->(pvVar1);
    (*pAVar2->_vptr_ASTNodeBasic[5])(pAVar2,scope,out);
    std::operator<<(out,"    xor\n");
    vpl::Scope::Pop(scope);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                children_[0]->BuildProgram(scope, out);
                for (size_t i = 1; i < children_.size(); ++i) {
                    children_[i]->BuildProgram(scope, out);
                    out << "    xor\n";
                    scope->Pop();
                }
            }